

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::OuterEdgeVertexSetIndexIndependenceCase::iterate
          (OuterEdgeVertexSetIndexIndependenceCase *this)

{
  float *pfVar1;
  float fVar2;
  RenderContext *pRVar3;
  bool bVar4;
  void *pvVar5;
  _func_int **pp_Var6;
  pointer pfVar7;
  pointer pOVar8;
  bool bVar9;
  int i;
  int iVar10;
  deUint32 dVar11;
  uint uVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  float *pfVar13;
  long lVar14;
  ulong uVar15;
  _Rb_tree_node_base *p_Var16;
  char *pcVar17;
  TestLog *pTVar18;
  size_t sVar19;
  byte bVar20;
  float fVar21;
  long lVar22;
  pointer pfVar23;
  ulong uVar24;
  _Rb_tree_node_base *p_Var25;
  float fVar26;
  float *__result;
  float *pfVar27;
  _Rb_tree_node_base *p_Var28;
  pointer this_00;
  ulong uVar29;
  _Rb_tree_const_iterator<tcu::Vector<float,_3>_> __last1;
  int numIndentationSpaces;
  char *__s;
  ulong uVar30;
  bool bVar31;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar32;
  Vec3Set currentEdgeVertices;
  vector<float,_std::allocator<float>_> patchTessLevels_1;
  vector<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
  edgeDescriptions;
  Result tfResult;
  RandomViewport viewport;
  Vec3Set firstEdgeVertices;
  VertexArrayBinding bindings [1];
  vector<float,_std::allocator<float>_> patchTessLevels;
  Random rnd;
  TFHandler tfHandler;
  ulong local_598;
  undefined1 local_590 [32];
  _Base_ptr local_570;
  size_t local_568;
  long local_560;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_558;
  deUint32 local_54c;
  float local_548;
  float local_544;
  vector<float,_std::allocator<float>_> local_540;
  vector<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
  local_528;
  long local_510;
  Result local_508;
  RandomViewport local_4e8;
  string local_4d8;
  string local_4b8;
  string local_498;
  string local_478;
  string local_458;
  string local_438;
  set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
  local_418;
  double local_3e8;
  OuterEdgeVertexSetIndexIndependenceCase *local_3e0;
  undefined1 local_3d8 [8];
  _Alloc_hider local_3d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c0;
  int local_3b0;
  VertexArrayPointer local_3a8;
  undefined1 local_380 [4];
  float fStack_37c;
  undefined1 local_378 [16];
  _func_int *local_368 [2];
  int local_358;
  ios_base local_308 [264];
  undefined1 local_200 [8];
  _func_int **local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0 [6];
  ios_base local_188 [264];
  TransformFeedbackHandler<tcu::Vector<float,_3>_> local_80;
  
  local_558 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pRVar3 = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar10 = (*pRVar3->_vptr_RenderContext[4])(pRVar3);
  dVar11 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p
                       );
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&local_4e8,(RenderTarget *)CONCAT44(extraout_var,iVar10),0x10,0x10,dVar11);
  iVar10 = (*pRVar3->_vptr_RenderContext[3])(pRVar3);
  lVar22 = CONCAT44(extraout_var_00,iVar10);
  dVar11 = (((this->m_program).m_ptr)->m_program).m_program;
  outerEdgeDescriptions(&local_528,this->m_primitiveType);
  local_54c = dVar11;
  (**(code **)(lVar22 + 0x1680))(dVar11);
  (**(code **)(lVar22 + 0x1a00))(local_4e8.x,local_4e8.y,local_4e8.width,local_4e8.height);
  (**(code **)(lVar22 + 0xfd8))(0x8e72,6);
  lVar22 = 4;
  pfVar27 = iterate::singleOuterEdgeLevels;
  do {
    if (*pfVar27 <= *(float *)((long)iterate::singleOuterEdgeLevels + lVar22) &&
        *(float *)((long)iterate::singleOuterEdgeLevels + lVar22) != *pfVar27) {
      pfVar27 = (float *)((long)iterate::singleOuterEdgeLevels + lVar22);
    }
    lVar22 = lVar22 + 4;
  } while (lVar22 != 0x30);
  fVar26 = *pfVar27;
  deRandom_init((deRandom *)local_200,0x7b);
  generateRandomPatchTessLevels
            ((vector<float,_std::allocator<float>_> *)local_380,1,0,fVar26,(Random *)local_200);
  iVar10 = referenceVertexCount
                     (this->m_primitiveType,this->m_spacing,this->m_usePointMode,
                      (float *)CONCAT44(fStack_37c,local_380),
                      (float *)CONCAT44(fStack_37c,local_380) + 2);
  pvVar5 = (void *)CONCAT44(fStack_37c,local_380);
  if (pvVar5 != (void *)0x0) {
    operator_delete(pvVar5,local_378._8_8_ - (long)pvVar5);
  }
  __last1._M_node = (_Base_ptr)((this->super_TestCase).m_context)->m_renderCtx;
  TransformFeedbackHandler<tcu::Vector<float,_3>_>::TransformFeedbackHandler
            (&local_80,(RenderContext *)__last1._M_node,iVar10);
  local_560 = 0;
  local_3e0 = this;
  do {
    local_418._M_t._M_impl._0_1_ = (Functional)0x0;
    local_418._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_418._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_418._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_418._M_t._M_impl.super__Rb_tree_header._M_header;
    local_418._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    iVar10 = (int)((ulong)((long)local_528.
                                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_528.
                                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 4);
    bVar4 = 0 < iVar10;
    local_418._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_418._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if (0 < iVar10) {
      local_548 = iterate::singleOuterEdgeLevels[local_560];
      local_3e8 = (double)local_548;
      local_510 = 8;
      local_598 = 0;
      do {
        pOVar8 = local_528.
                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        deRandom_init((deRandom *)local_380,0x7b);
        fVar26 = (float)local_598;
        generateRandomPatchTessLevels(&local_540,1,(int)fVar26,local_548,(Random *)local_380);
        local_200 = (undefined1  [8])local_1f0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"in_v_attr","");
        pfVar7 = local_540.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        pfVar23 = local_540.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start;
        local_380 = (undefined1  [4])0x1;
        local_378._0_8_ = local_368;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_378,local_200,(pointer)((long)local_1f8 + (long)local_200));
        local_358 = 0;
        local_3d8._0_4_ = local_380;
        local_3d0._M_p = (pointer)&local_3c0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3d0,local_378._0_8_,local_378._8_8_ + local_378._0_8_);
        local_3b0 = local_358;
        local_3a8.componentType = VTX_COMP_FLOAT;
        local_3a8.convert = VTX_COMP_CONVERT_NONE;
        local_3a8.numComponents = 1;
        local_3a8.numElements = (int)((ulong)((long)pfVar7 - (long)pfVar23) >> 2);
        local_3a8.stride = 0;
        local_3a8.data = pfVar23;
        if ((_func_int **)local_378._0_8_ != local_368) {
          operator_delete((void *)local_378._0_8_,(ulong)(local_368[0] + 1));
        }
        if (local_200 != (undefined1  [8])local_1f0) {
          operator_delete((void *)local_200,local_1f0[0]._M_allocated_capacity + 1);
        }
        local_380 = SUB84(local_558,0);
        fStack_37c = (float)((ulong)local_558 >> 0x20);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_378);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_378,"Testing with outer tessellation level ",0x26);
        std::ostream::_M_insert<double>(local_3e8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_378," for the ",9);
        this_00 = pOVar8 + local_598;
        Functional::(anonymous_namespace)::OuterEdgeDescription::description_abi_cxx11_
                  ((string *)local_200,this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_378,(char *)local_200,(long)local_1f8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_378," edge, and with various levels for other edges",0x2e);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_380,(EndMessageToken *)&tcu::TestLog::EndMessage);
        if (local_200 != (undefined1  [8])local_1f0) {
          operator_delete((void *)local_200,local_1f0[0]._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_378);
        std::ios_base::~ios_base(local_308);
        dVar11 = 0;
        if (this->m_usePointMode == false) {
          dVar11 = 0xffffffff;
          if ((ulong)this->m_primitiveType < 3) {
            dVar11 = *(deUint32 *)(&DAT_01c85fd0 + (ulong)this->m_primitiveType * 4);
          }
        }
        TransformFeedbackHandler<tcu::Vector<float,_3>_>::renderAndGetPrimitives
                  (&local_508,&local_80,local_54c,dVar11,1,(VertexArrayBinding *)local_3d8,
                   (int)((ulong)((long)local_540.super__Vector_base<float,_std::allocator<float>_>.
                                       _M_impl.super__Vector_impl_data._M_finish -
                                (long)local_540.super__Vector_base<float,_std::allocator<float>_>.
                                      _M_impl.super__Vector_impl_data._M_start) >> 2));
        pfVar27 = local_540.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start + 2;
        pfVar23 = local_540.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar12 = referenceVertexCount
                           (this->m_primitiveType,this->m_spacing,this->m_usePointMode,
                            local_540.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start,pfVar27);
        lVar22 = local_510;
        numIndentationSpaces = (int)pfVar27;
        iVar10 = (int)pfVar23;
        if (uVar12 == (int)((ulong)((long)local_508.varying.
                                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_508.varying.
                                         super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                      -0x55555555) {
          local_590[0] = (Functional)0x0;
          local_590._8_4_ = _S_red;
          fVar21 = 0.0;
          local_590._16_8_ = (_Base_ptr)0x0;
          local_590._24_8_ = local_590 + 8;
          local_568 = 0;
          local_570 = (_Base_ptr)local_590._24_8_;
          if (0 < (int)uVar12) {
            uVar30 = 0;
            pp_Var6 = (_func_int **)local_378._0_8_;
            do {
              local_378._4_4_ = (undefined4)((ulong)pp_Var6 >> 0x20);
              local_378._0_4_ = SUB84(pp_Var6,0);
              pfVar13 = local_508.varying.
                        super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar30].m_data;
              fVar21 = (float)this_00->numConstantCoordinateValueChoices;
              uVar24 = (ulong)(int)fVar21;
              bVar31 = 0 < (long)uVar24;
              if ((long)uVar24 < 1) {
LAB_01456843:
                if (bVar31) goto LAB_0145684b;
              }
              else {
                fVar2 = pfVar13[this_00->constantCoordinateIndex];
                if ((fVar2 != this_00->constantCoordinateValueChoices[0]) ||
                   (NAN(fVar2) || NAN(this_00->constantCoordinateValueChoices[0]))) {
                  uVar15 = 1;
                  do {
                    uVar29 = uVar15;
                    if (uVar24 == uVar29) break;
                    pfVar1 = (float *)((long)pOVar8->constantCoordinateValueChoices +
                                      uVar29 * 4 + lVar22 + -8);
                    uVar15 = uVar29 + 1;
                  } while ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1)));
                  bVar31 = uVar29 < uVar24;
                  goto LAB_01456843;
                }
LAB_0145684b:
                fVar21 = (float)this->m_primitiveType;
                if (fVar21 == 1.4013e-45) {
                  local_544 = -1.0;
                  if ((uint)fVar26 < 4) {
                    fVar21 = (float)((&switchD_014568ca::switchdataD_01c850e4)
                                     [local_598 & 0xffffffff] + 0x1c850e4);
                    switch(local_598 & 0xffffffff) {
                    default:
                      pfVar13 = pfVar13 + 1;
                      break;
                    case 1:
                    case 3:
                      break;
                    }
                    local_544 = *pfVar13;
                  }
                  fStack_37c = 0.0;
                  local_378._0_4_ = 0.0;
                  local_380 = (undefined1  [4])local_544;
                  pVar32 = std::
                           _Rb_tree<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_std::_Identity<tcu::Vector<float,_3>_>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                           ::_M_get_insert_unique_pos
                                     ((_Rb_tree<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_std::_Identity<tcu::Vector<float,_3>_>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                       *)local_590,(key_type *)local_380);
                  p_Var28 = pVar32.second;
                  pp_Var6 = (_func_int **)CONCAT44(local_378._4_4_,local_378._0_4_);
                  if (p_Var28 != (_Rb_tree_node_base *)0x0) {
                    bVar31 = true;
                    if ((_Rb_tree_node_base *)(local_590 + 8) != p_Var28 &&
                        pVar32.first == (_Rb_tree_node_base *)0x0) {
                      if ((float)p_Var28[1]._M_color <= local_544) {
                        if (local_544 <= (float)p_Var28[1]._M_color) {
                          uVar24 = 0;
                          do {
                            uVar15 = uVar24;
                            if (uVar15 == 2) {
                              uVar15 = 2;
                              bVar20 = 2;
                              goto LAB_014569f1;
                            }
                            if ((&fStack_37c)[uVar15] <
                                *(float *)(&p_Var28[1].field_0x4 + uVar15 * 4)) {
                              bVar20 = 1;
                              goto LAB_014569f1;
                            }
                            uVar24 = uVar15 + 1;
                          } while ((&fStack_37c)[uVar15] <=
                                   *(float *)(&p_Var28[1].field_0x4 + uVar15 * 4));
                          bVar20 = 0;
LAB_014569f1:
                          bVar31 = (bool)(uVar15 < 2 & bVar20);
                        }
                        else {
                          bVar31 = false;
                        }
                      }
                    }
                    p_Var16 = (_Rb_tree_node_base *)operator_new(0x30);
                    *(undefined4 *)&p_Var16[1]._M_parent = local_378._0_4_;
                    *(ulong *)(p_Var16 + 1) = CONCAT44(fStack_37c,local_380);
                    p_Var25 = (_Rb_tree_node_base *)(local_590 + 8);
                    std::_Rb_tree_insert_and_rebalance(bVar31,p_Var16,p_Var28,p_Var25);
                    fVar21 = SUB84(p_Var25,0);
                    local_568 = local_568 + 1;
                    this = local_3e0;
                    pp_Var6 = (_func_int **)CONCAT44(local_378._4_4_,local_378._0_4_);
                  }
                }
                else if (fVar21 == 0.0) {
                  if (fVar26 == 0.0) {
                    fVar21 = pfVar13[2];
                    local_380 = SUB84(*(undefined8 *)pfVar13,0);
                    fStack_37c = (float)((ulong)*(undefined8 *)pfVar13 >> 0x20);
                    local_378._0_4_ = fVar21;
                  }
                  else {
                    fVar21 = fVar26;
                    if (fVar26 == 1.4013e-45) {
                      fStack_37c = *pfVar13;
                      local_380 = (undefined1  [4])pfVar13[1];
                      local_378._0_4_ = pfVar13[2];
                    }
                    else if (fVar26 == 2.8026e-45) {
                      local_380 = (undefined1  [4])pfVar13[2];
                      fStack_37c = pfVar13[1];
                      local_378._0_4_ = *pfVar13;
                    }
                    else {
                      lVar14 = 0;
                      do {
                        *(undefined4 *)(local_380 + lVar14 * 4) = 0xbf800000;
                        lVar14 = lVar14 + 1;
                      } while (lVar14 != 3);
                    }
                  }
                  std::
                  set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                  ::insert((set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                            *)local_590,(value_type *)local_380);
                  pp_Var6 = (_func_int **)CONCAT44(local_378._4_4_,local_378._0_4_);
                }
              }
              local_378._0_8_ = pp_Var6;
              numIndentationSpaces = (int)pfVar27;
              uVar30 = uVar30 + 1;
              pp_Var6 = (_func_int **)local_378._0_8_;
            } while (uVar30 != uVar12);
          }
          if (local_598 == 0) {
            bVar31 = true;
            __last1._M_node = (_Base_ptr)local_590;
            std::
            set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
            ::operator=(&local_418,
                        (set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                         *)__last1._M_node);
          }
          else {
            if (local_568 == local_418._M_t._M_impl.super__Rb_tree_header._M_node_count) {
              __last1._M_node = (_Base_ptr)(local_590 + 8);
              bVar9 = std::__equal<false>::
                      equal<std::_Rb_tree_const_iterator<tcu::Vector<float,3>>,std::_Rb_tree_const_iterator<tcu::Vector<float,3>>>
                                ((_Rb_tree_const_iterator<tcu::Vector<float,_3>_>)local_590._24_8_,
                                 __last1,(_Rb_tree_const_iterator<tcu::Vector<float,_3>_>)
                                         local_418._M_t._M_impl.super__Rb_tree_header._M_header.
                                         _M_left);
              bVar31 = true;
              if (bVar9) goto LAB_0145701b;
            }
            if (this->m_primitiveType == TESSPRIMITIVETYPE_QUADS) {
              __s = "(x, 0)";
              if (fVar26 != 1.4013e-45) {
                if (fVar26 != 2.8026e-45) {
                  bVar31 = local_598 == 3;
                  pcVar17 = "(x, 0)";
                  goto LAB_01456ca2;
                }
                __s = "(y, 0)";
              }
            }
            else if (this->m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
              __s = "(y, x, z)";
              if (local_598 != 1) {
                bVar31 = local_598 == 2;
                pcVar17 = "(z, y, x)";
LAB_01456ca2:
                __s = (char *)0x0;
                if (bVar31) {
                  __s = pcVar17;
                }
              }
            }
            else {
              __s = (char *)0x0;
            }
            local_200 = (undefined1  [8])local_558;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1f8,"Failure: the set of vertices on the ",0x24);
            Functional::(anonymous_namespace)::OuterEdgeDescription::description_abi_cxx11_
                      (&local_438,this_00);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1f8,local_438._M_dataplus._M_p,local_438._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f8," edge",5);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1f8," doesn\'t match the set of vertices on the ",0x2a);
            pOVar8 = local_528.
                     super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            Functional::(anonymous_namespace)::OuterEdgeDescription::description_abi_cxx11_
                      (&local_458,
                       local_528.
                       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                       ._M_impl.super__Vector_impl_data._M_start);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1f8,local_458._M_dataplus._M_p,local_458._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f8," edge",5);
            pTVar18 = tcu::MessageBuilder::operator<<
                                ((MessageBuilder *)local_200,
                                 (EndMessageToken *)&tcu::TestLog::EndMessage);
            local_380 = SUB84(pTVar18,0);
            fStack_37c = (float)((ulong)pTVar18 >> 0x20);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_378);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_378,"Note: set of vertices on ",0x19);
            Functional::(anonymous_namespace)::OuterEdgeDescription::description_abi_cxx11_
                      (&local_478,this_00);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_378,local_478._M_dataplus._M_p,local_478._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_378," edge, components swizzled like ",0x20);
            if (__s == (char *)0x0) {
              std::ios::clear((int)*(_func_int **)(local_378._0_8_ + -0x18) +
                              (int)(ostringstream *)local_378);
            }
            else {
              sVar19 = strlen(__s);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_378,__s,sVar19);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_378," to match component order on first edge:\n",0x29);
            containerStr<std::set<tcu::Vector<float,3>,deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,std::allocator<tcu::Vector<float,3>>>>
                      (&local_498,(Functional *)local_590,
                       (set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                        *)0x0,(int)fVar21,numIndentationSpaces);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_378,local_498._M_dataplus._M_p,local_498._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_378,"\non ",4);
            Functional::(anonymous_namespace)::OuterEdgeDescription::description_abi_cxx11_
                      (&local_4b8,pOVar8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_378,local_4b8._M_dataplus._M_p,local_4b8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_378," edge:\n",7);
            containerStr<std::set<tcu::Vector<float,3>,deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,std::allocator<tcu::Vector<float,3>>>>
                      (&local_4d8,(Functional *)&local_418,
                       (set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                        *)0x0,(int)fVar21,numIndentationSpaces);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_378,local_4d8._M_dataplus._M_p,local_4d8._M_string_length);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_380,(EndMessageToken *)&tcu::TestLog::EndMessage);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
              operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
              operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_498._M_dataplus._M_p != &local_498.field_2) {
              operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_478._M_dataplus._M_p != &local_478.field_2) {
              operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_378);
            std::ios_base::~ios_base(local_308);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_458._M_dataplus._M_p != &local_458.field_2) {
              operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_438._M_dataplus._M_p != &local_438.field_2) {
              operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f8);
            std::ios_base::~ios_base(local_188);
            __last1._M_node = (_Base_ptr)&DAT_00000001;
            tcu::TestContext::setTestResult
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                       QP_TEST_RESULT_FAIL,"Invalid set of vertices");
            bVar31 = false;
          }
LAB_0145701b:
          std::
          _Rb_tree<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_std::_Identity<tcu::Vector<float,_3>_>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
          ::_M_erase((_Rb_tree<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_std::_Identity<tcu::Vector<float,_3>_>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                      *)local_590._16_8_,(_Link_type)__last1._M_node);
        }
        else {
          local_200 = (undefined1  [8])local_558;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f8,
                     "Failure: the number of vertices returned by transform feedback is ",0x42);
          std::ostream::_M_insert<unsigned_long>((ulong)&local_1f8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f8,", expected ",0xb);
          std::ostream::operator<<((ostringstream *)&local_1f8,uVar12);
          pTVar18 = tcu::MessageBuilder::operator<<
                              ((MessageBuilder *)local_200,
                               (EndMessageToken *)&tcu::TestLog::EndMessage);
          local_380 = SUB84(pTVar18,0);
          fStack_37c = (float)((ulong)pTVar18 >> 0x20);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_378);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_378,
                     "Note: rendered 1 patch, tessellation levels are (in order [inner0, inner1, outer0, outer1, outer2, outer3]):\n"
                     ,0x6d);
          containerStr<std::vector<float,std::allocator<float>>>
                    ((string *)local_590,(Functional *)&local_540,
                     (vector<float,_std::allocator<float>_> *)0x6,iVar10,numIndentationSpaces);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_378,(char *)CONCAT71(local_590._1_7_,local_590[0]),
                     CONCAT44(local_590._12_4_,local_590._8_4_));
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_380,(EndMessageToken *)&tcu::TestLog::EndMessage);
          if ((undefined1 *)CONCAT71(local_590._1_7_,local_590[0]) != local_590 + 0x10) {
            operator_delete((undefined1 *)CONCAT71(local_590._1_7_,local_590[0]),
                            (ulong)(local_590._16_8_ + 1));
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_378);
          std::ios_base::~ios_base(local_308);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f8);
          std::ios_base::~ios_base(local_188);
          __last1._M_node = (_Base_ptr)&DAT_00000001;
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_FAIL,"Invalid set of vertices");
          bVar31 = false;
        }
        if (local_508.varying.
            super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          __last1._M_node =
               (_Base_ptr)
               ((long)local_508.varying.
                      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
               (long)local_508.varying.
                     super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
          operator_delete(local_508.varying.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,(ulong)__last1._M_node);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d0._M_p != &local_3c0) {
          __last1._M_node = (_Base_ptr)(local_3c0._M_allocated_capacity + 1);
          operator_delete(local_3d0._M_p,(ulong)__last1._M_node);
        }
        if (local_540.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (float *)0x0) {
          __last1._M_node =
               (_Base_ptr)
               ((long)local_540.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage -
               (long)local_540.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start);
          operator_delete(local_540.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,(ulong)__last1._M_node);
        }
        if (!bVar31) {
          bVar31 = true;
          goto LAB_014570db;
        }
        local_598 = local_598 + 1;
        lVar22 = (long)(int)((ulong)((long)local_528.
                                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_528.
                                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 4);
        local_510 = local_510 + 0x10;
        bVar4 = (long)local_598 < lVar22;
      } while ((long)local_598 < lVar22);
    }
    bVar31 = false;
LAB_014570db:
    std::
    _Rb_tree<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_std::_Identity<tcu::Vector<float,_3>_>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
    ::_M_erase((_Rb_tree<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_std::_Identity<tcu::Vector<float,_3>_>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                *)local_418._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
               (_Link_type)__last1._M_node);
    if (bVar4) goto LAB_0145710b;
    local_560 = local_560 + 1;
  } while (local_560 != 0xc);
  bVar31 = false;
LAB_0145710b:
  glu::ObjectWrapper::~ObjectWrapper(&local_80.m_tfPrimQuery.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&local_80.m_tfBuffer.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&local_80.m_tf.super_ObjectWrapper);
  if (!bVar31) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  if (local_528.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_528.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_528.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_528.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return STOP;
}

Assistant:

OuterEdgeVertexSetIndexIndependenceCase::IterateResult OuterEdgeVertexSetIndexIndependenceCase::iterate (void)
{
	typedef TransformFeedbackHandler<Vec3> TFHandler;

	TestLog&							log							= m_testCtx.getLog();
	const RenderContext&				renderCtx					= m_context.getRenderContext();
	const RandomViewport				viewport					(renderCtx.getRenderTarget(), RENDER_SIZE, RENDER_SIZE, deStringHash(getName()));
	const glw::Functions&				gl							= renderCtx.getFunctions();
	const deUint32						programGL					= m_program->getProgram();

	static const float					singleOuterEdgeLevels[]		= { 1.0f, 1.2f, 1.9f, 2.3f, 2.8f, 3.3f, 3.8f, 10.2f, 1.6f, 24.4f, 24.7f, 63.0f };
	const vector<OuterEdgeDescription>	edgeDescriptions			= outerEdgeDescriptions(m_primitiveType);

	gl.useProgram(programGL);
	setViewport(gl, viewport);
	gl.patchParameteri(GL_PATCH_VERTICES, 6);

	{
		// Compute the number vertices in the largest draw call, so we can allocate the TF buffer just once.
		int maxNumVerticesInDrawCall = 0;
		{
			const vector<float> patchTessLevels = generatePatchTessLevels(1, 0 /* outer-edge index doesn't affect vertex count */, arrayMax(singleOuterEdgeLevels));
			maxNumVerticesInDrawCall = referenceVertexCount(m_primitiveType, m_spacing, m_usePointMode, &patchTessLevels[0], &patchTessLevels[2]);
		}

		{
			const TFHandler tfHandler(m_context.getRenderContext(), maxNumVerticesInDrawCall);

			for (int outerEdgeLevelCaseNdx = 0; outerEdgeLevelCaseNdx < DE_LENGTH_OF_ARRAY(singleOuterEdgeLevels); outerEdgeLevelCaseNdx++)
			{
				typedef std::set<Vec3, VecLexLessThan<3> > Vec3Set;

				Vec3Set firstEdgeVertices;

				for (int outerEdgeIndex = 0; outerEdgeIndex < (int)edgeDescriptions.size(); outerEdgeIndex++)
				{
					const OuterEdgeDescription&		edgeDesc			= edgeDescriptions[outerEdgeIndex];
					const vector<float>				patchTessLevels		= generatePatchTessLevels(1, outerEdgeIndex, singleOuterEdgeLevels[outerEdgeLevelCaseNdx]);
					const glu::VertexArrayBinding	bindings[]			= { glu::va::Float("in_v_attr", 1, (int)patchTessLevels.size(), 0, &patchTessLevels[0]) };

					log << TestLog::Message << "Testing with outer tessellation level " << singleOuterEdgeLevels[outerEdgeLevelCaseNdx]
											<< " for the " << edgeDesc.description() << " edge, and with various levels for other edges" << TestLog::EndMessage;

					{
						const TFHandler::Result		tfResult		= tfHandler.renderAndGetPrimitives(programGL, outputPrimitiveTypeGL(m_primitiveType, m_usePointMode),
																										DE_LENGTH_OF_ARRAY(bindings), &bindings[0], (int)patchTessLevels.size());
						const int					refNumVertices	= referenceVertexCount(m_primitiveType, m_spacing, m_usePointMode, &patchTessLevels[0], &patchTessLevels[2]);

						if ((int)tfResult.varying.size() != refNumVertices)
						{
							log << TestLog::Message << "Failure: the number of vertices returned by transform feedback is "
													<< tfResult.varying.size() << ", expected " << refNumVertices << TestLog::EndMessage
								<< TestLog::Message << "Note: rendered 1 patch, tessellation levels are (in order [inner0, inner1, outer0, outer1, outer2, outer3]):\n"
													<< containerStr(patchTessLevels, 6) << TestLog::EndMessage;

							m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid set of vertices");
							return STOP;
						}

						{
							Vec3Set currentEdgeVertices;

							// Get the vertices on the current outer edge.
							for(int vtxNdx = 0; vtxNdx < refNumVertices; vtxNdx++)
							{
								const Vec3& vtx = tfResult.varying[vtxNdx];
								if (edgeDesc.contains(vtx))
								{
									// Swizzle components to match the order of the first edge.
									if (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES)
									{
										currentEdgeVertices.insert(outerEdgeIndex == 0 ? vtx
																	: outerEdgeIndex == 1 ? vtx.swizzle(1, 0, 2)
																	: outerEdgeIndex == 2 ? vtx.swizzle(2, 1, 0)
																	: Vec3(-1.0f));
									}
									else if (m_primitiveType == TESSPRIMITIVETYPE_QUADS)
									{
										currentEdgeVertices.insert(Vec3(outerEdgeIndex == 0 ? vtx.y()
																		: outerEdgeIndex == 1 ? vtx.x()
																		: outerEdgeIndex == 2 ? vtx.y()
																		: outerEdgeIndex == 3 ? vtx.x()
																		: -1.0f,
																		0.0f, 0.0f));
									}
									else
										DE_ASSERT(false);
								}
							}

							if (outerEdgeIndex == 0)
								firstEdgeVertices = currentEdgeVertices;
							else
							{
								// Compare vertices of this edge to those of the first edge.

								if (currentEdgeVertices != firstEdgeVertices)
								{
									const char* const swizzleDesc = m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES ? (outerEdgeIndex == 1 ? "(y, x, z)"
																													: outerEdgeIndex == 2 ? "(z, y, x)"
																													: DE_NULL)
																	: m_primitiveType == TESSPRIMITIVETYPE_QUADS ? (outerEdgeIndex == 1 ? "(x, 0)"
																												: outerEdgeIndex == 2 ? "(y, 0)"
																												: outerEdgeIndex == 3 ? "(x, 0)"
																												: DE_NULL)
																	: DE_NULL;

									log << TestLog::Message << "Failure: the set of vertices on the " << edgeDesc.description() << " edge"
															<< " doesn't match the set of vertices on the " << edgeDescriptions[0].description() << " edge" << TestLog::EndMessage
										<< TestLog::Message << "Note: set of vertices on " << edgeDesc.description() << " edge, components swizzled like " << swizzleDesc
															<< " to match component order on first edge:\n" << containerStr(currentEdgeVertices, 5)
															<< "\non " << edgeDescriptions[0].description() << " edge:\n" << containerStr(firstEdgeVertices, 5) << TestLog::EndMessage;
									m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid set of vertices");
									return STOP;
								}
							}
						}
					}
				}
			}
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}